

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::FilenameIdentifier(string *filename)

{
  bool bVar1;
  AlphaNum *this;
  AlphaNum *pAVar2;
  char *pcVar3;
  uchar *puVar4;
  ulong in_RSI;
  string *in_RDI;
  Hex hex;
  int i;
  string *result;
  AlphaNum *in_stack_000000b8;
  string *in_stack_000000c0;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 local_98 [12];
  AlphaNum local_88 [2];
  int local_18;
  undefined1 local_11;
  ulong local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_18 = 0;
  while( true ) {
    this = (AlphaNum *)(long)local_18;
    pAVar2 = (AlphaNum *)std::__cxx11::string::size();
    if (pAVar2 <= this) break;
    pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
    bVar1 = ascii_isalnum(*pcVar3);
    if (bVar1) {
      std::__cxx11::string::operator[](local_10);
      std::__cxx11::string::push_back((char)in_RDI);
    }
    else {
      strings::AlphaNum::AlphaNum(this,(char *)CONCAT17(bVar1,in_stack_ffffffffffffff48));
      puVar4 = (uchar *)std::__cxx11::string::operator[](local_10);
      strings::Hex::Hex<unsigned_char>((Hex *)local_98,*puVar4,NO_PAD);
      hex._12_4_ = 0;
      hex.value = local_98._0_8_;
      hex.spec = local_98._8_4_;
      strings::AlphaNum::AlphaNum(local_88,hex);
      StrAppend(in_stack_000000c0,in_stack_000000b8,(AlphaNum *)result);
    }
    local_18 = local_18 + 1;
  }
  return in_RDI;
}

Assistant:

std::string FilenameIdentifier(const std::string& filename) {
  std::string result;
  for (int i = 0; i < filename.size(); i++) {
    if (ascii_isalnum(filename[i])) {
      result.push_back(filename[i]);
    } else {
      // Not alphanumeric.  To avoid any possibility of name conflicts we
      // use the hex code for the character.
      StrAppend(&result, "_", strings::Hex(static_cast<uint8>(filename[i])));
    }
  }
  return result;
}